

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::
emplace_helper<QGuiApplicationPrivate::SynthesizedMouseData>
          (QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *this,QWindow **key,
          SynthesizedMouseData *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  iterator<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_> *in_RDX;
  Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QWindow*,QGuiApplicationPrivate::SynthesizedMouseData>>::
  findOrInsert<QWindow*>(in_RSI,(QWindow **)in_RDX);
  QHashPrivate::
  iterator<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>::node
            (in_RDX);
  QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::
  createInPlace<QGuiApplicationPrivate::SynthesizedMouseData>
            (in_stack_ffffffffffffff90,(QWindow **)in_stack_ffffffffffffff88,
             (SynthesizedMouseData *)0x387993);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = (Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_> *)
         in_stack_ffffffffffffff90;
  iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }